

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ExpressionSyntax *node;
  DistWeightSyntax *pDVar1;
  Token TVar2;
  BumpAllocator *unaff_retaddr;
  BumpAllocator *in_stack_00000118;
  Token *in_stack_00000120;
  Info *args_2;
  Token *args_1;
  
  args_1 = (Token *)__child_stack;
  TVar2 = parsing::Token::deepClone(in_stack_00000120,in_stack_00000118);
  args_2 = TVar2.info;
  TVar2 = parsing::Token::deepClone(in_stack_00000120,in_stack_00000118);
  node = TVar2._0_8_;
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa5594f);
  deepClone<slang::syntax::ExpressionSyntax>(node,(BumpAllocator *)__child_stack);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DistWeightSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&>
                     (unaff_retaddr,(Token *)__fn,args_1,(ExpressionSyntax *)args_2);
  return (int)pDVar1;
}

Assistant:

static SyntaxNode* clone(const DistWeightSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<DistWeightSyntax>(
        node.op.deepClone(alloc),
        node.extraOp.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.expr, alloc)
    );
}